

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O1

void __thiscall RenderTarget::add(RenderTarget *this,Renderable *object)

{
  pointer ppRVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  Renderable *local_20;
  Renderable *object_local;
  
  iVar2 = depth;
  object->depth = depth;
  ppRVar1 = (this->objects).
            super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar3 = (long)(this->objects).
                super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppRVar1;
  bVar8 = lVar3 != 0;
  local_20 = object;
  if (bVar8) {
    if ((*ppRVar1)->depth < iVar2) {
      uVar5 = 0;
    }
    else {
      uVar4 = lVar3 >> 3;
      uVar6 = 1;
      do {
        uVar5 = uVar6;
        bVar8 = uVar5 < uVar4;
        if (uVar4 <= uVar5) goto LAB_0017dfe5;
        uVar6 = (ulong)((int)uVar5 + 1);
      } while (iVar2 <= ppRVar1[uVar5]->depth);
    }
    std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::insert
              (&this->objects,(const_iterator)(ppRVar1 + uVar5),&local_20);
    if (bVar8) {
      return;
    }
  }
LAB_0017dfe5:
  ppRVar1 = (this->objects).
            super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(this->objects).
                        super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1) >> 3 & 0xffffffff
  ;
  do {
    uVar6 = uVar6 - 1;
    uVar7 = (uint)uVar6;
    if ((int)uVar7 < 0) goto LAB_0017e035;
  } while (ppRVar1[uVar7 & 0x7fffffff]->depth != depth);
  std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::insert
            (&this->objects,(const_iterator)(ppRVar1 + (ulong)(uVar7 & 0x7fffffff) + 1),&local_20);
  if ((int)uVar7 < 0) {
LAB_0017e035:
    std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::insert
              (&this->objects,
               (const_iterator)
               (this->objects).
               super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_20);
  }
  return;
}

Assistant:

void add(Renderable *object){
		object->depth = depth;
		for(unsigned i = 0; i < objects.size(); ++i){
			if(objects[i]->depth < depth){
				objects.insert(objects.begin()+i, object);
				return;
			}
		}
		for(int i = objects.size()-1; i >= 0; i--){
			if(objects[i]->depth == depth){
				objects.insert(objects.begin()+i+1, object);
				return;
			}
		}
		objects.insert(objects.end(), object);

	}